

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picosha2.h
# Opt level: O0

void __thiscall picosha2::hash256_one_by_one::add_to_data_length(hash256_one_by_one *this,word_t n)

{
  ulong local_28;
  size_t i;
  word_t carry;
  word_t n_local;
  hash256_one_by_one *this_local;
  
  i = 0;
  this->data_length_digits_[0] = n + this->data_length_digits_[0];
  for (local_28 = 0;
      (local_28 < 4 &&
      (this->data_length_digits_[local_28] = i + this->data_length_digits_[local_28],
      0xffff < this->data_length_digits_[local_28])); local_28 = local_28 + 1) {
    i = this->data_length_digits_[local_28] >> 0x10;
    this->data_length_digits_[local_28] = this->data_length_digits_[local_28] & 0xffff;
  }
  return;
}

Assistant:

void add_to_data_length(word_t n) {
        word_t carry = 0;
        data_length_digits_[0] += n;
        for (std::size_t i = 0; i < 4; ++i) {
            data_length_digits_[i] += carry;
            if (data_length_digits_[i] >= 65536u) {
                carry = data_length_digits_[i] >> 16;
                data_length_digits_[i] &= 65535u;
            } else {
                break;
            }
        }
    }